

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

SearchResult<int,_false> __thiscall
phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
::linear_search_impl<int,phmap::priv::upper_bound_adapter<phmap::Less<int>>>
          (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
           *this,int *k,int s,int e)

{
  int iVar1;
  long lVar2;
  
  iVar1 = s;
  if (s < e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    lVar2 = 0;
    do {
      if (*k < *(int *)(this + lVar2 * 4 + (long)s * 4 + 0xc)) {
        return (SearchResult<int,_false>)(s + (int)lVar2);
      }
      lVar2 = lVar2 + 1;
      iVar1 = e;
    } while ((long)e - (long)s != lVar2);
  }
  return (SearchResult<int,_false>)iVar1;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }